

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void __thiscall Hex::Hexdumper<unsigned_char>::dump(Hexdumper<unsigned_char> *this,ostream *os)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ostream oVar4;
  bool bVar5;
  ostream oVar6;
  int iVar7;
  ostream *poVar8;
  uint uVar9;
  pair<const_unsigned_char_*,_const_unsigned_char_*> *ppVar10;
  int unitsperline;
  uchar *puVar11;
  uchar *first;
  uchar *puVar12;
  pair<const_unsigned_char_*,_const_unsigned_char_*> curline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> prevline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_80;
  long local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint64_t local_58;
  pair<const_unsigned_char_*,_const_unsigned_char_*> *local_50;
  uint64_t local_48;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_40;
  
  poVar8 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar8);
    poVar8[0xe0] = oVar4;
    poVar8[0xe1] = (ostream)0x1;
  }
  oVar4 = poVar8[0xe0];
  iVar7 = *(int *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  uVar9 = uVar1 & 0xb0;
  if ((uVar1 >> 10 & 1) != 0) {
    Hexdumper_base::getbaseofs(os);
  }
  local_48 = Hexdumper_base::getstep(os);
  local_58 = Hexdumper_base::getthreshold(os);
  unitsperline = 0x40;
  if ((uVar1 >> 0xb & 1) == 0) {
    unitsperline = 0x10;
  }
  if (uVar9 == 0x20) {
    unitsperline = 0x20;
  }
  if (iVar7 != -1) {
    unitsperline = iVar7;
  }
  first = this->_first;
  local_40.first = first;
  local_40.second = first;
  lVar2 = *(long *)os;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 0;
  puVar11 = this->_last;
  if (first < puVar11) {
    local_5c = uVar1 & 0x4a;
    local_70 = (long)unitsperline;
    local_60 = uVar1 >> 0xe & 1;
    local_64 = uVar1 >> 9 & 1;
    local_50 = (pair<const_unsigned_char_*,_const_unsigned_char_*> *)&this->_last;
    do {
      ppVar10 = local_50;
      if (unitsperline != 0) {
        local_80.first = first + local_70;
        if (first + local_70 < puVar11) {
          ppVar10 = &local_80;
        }
      }
      puVar11 = ppVar10->first;
      local_80.first = first;
      local_80.second = puVar11;
      if ((uVar1 >> 0xc & 1) == 0) {
LAB_001082d2:
        if ((uVar1 >> 10 & 1) != 0) {
          lVar2 = *(long *)os;
          *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 8;
          lVar2 = *(long *)(lVar2 + -0x18);
          poVar8 = os + lVar2;
          if (os[lVar2 + 0xe1] == (ostream)0x0) {
            oVar6 = (ostream)std::ios::widen((char)poVar8);
            poVar8[0xe0] = oVar6;
            poVar8[0xe1] = (ostream)0x1;
          }
          poVar8[0xe0] = (ostream)0x30;
          *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
               *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        }
        if ((uVar1 >> 0xb & 1) == 0) {
          output_hex(os,local_80.first,local_80.second,(char)oVar4,local_5c,SUB41(local_64,0),
                     SUB41(local_60,0));
          if ((unitsperline != 0) && ((long)puVar11 - (long)first != local_70)) {
            output_padding(os,unitsperline - (int)((long)puVar11 - (long)first),(char)oVar4);
          }
          if (uVar9 != 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
            goto LAB_001083bf;
          }
        }
        else {
LAB_001083bf:
          if (uVar9 != 0x20) {
            output_asc(os,local_80.first,local_80.second);
            if (unitsperline == 0) goto LAB_0010840d;
            if ((long)puVar11 - (long)first != local_70) {
              output_asc_padding(os,unitsperline - (int)((long)puVar11 - (long)first));
            }
          }
        }
        if (unitsperline != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        }
      }
      else {
        bVar5 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
                          (&local_40,&local_80);
        if (!bVar5) {
          local_40.first = local_80.first;
          local_40.second = local_80.second;
          goto LAB_001082d2;
        }
        iVar7 = count_identical_lines(first,local_50->first,unitsperline);
        if ((int)local_58 < iVar7) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"* [ 0x",6);
          *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
               *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)os,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," lines ]\n",9);
          puVar11 = first + iVar7 * unitsperline;
        }
        if (iVar7 <= (int)local_58) goto LAB_001082d2;
      }
LAB_0010840d:
      puVar12 = first + local_48;
      first = puVar11;
      if (local_48 != 0) {
        first = puVar12;
      }
      puVar11 = local_50->first;
    } while (first < puVar11);
  }
  Hexdumper_base::clearflags(os);
  return;
}

Assistant:

void dump(std::ostream& os) const
    {
        // make copy of current 'os' settings
        char filler = os.fill();  // what to output between hex numbers.
        int unitsperline = os.width();  // when not set: everything on one line
        // upl == 0 -> everything on one line
        // upl ==-1 -> unspecified -> use defaults
        //int unitwidth = os.precision(); // NOT USED (yet)
        int adjust = os.flags() & os.adjustfield;
        int numberbase = os.flags() & os.basefield;

        bool showbase = os.flags() & os.showbase;
        bool showpos = os.flags() & os.showpos;
        bool showoffset = os.flags() & os.showpoint;
        bool uppercasehex = os.flags() & os.uppercase;
        bool summarize = os.flags() & os.skipws;

        uint64_t ofs = showoffset ? getbaseofs(os) : 0;
        uint64_t step = getstep(os);

        int threshold = getthreshold(os);

        // showpos adjust
        //   yes     left    %+-b     ...    invalid
        //   yes     right   %+b     asc only
        //   no      left    %-b     hex only
        //   no      right   %b      hex + asc

        if (unitsperline==-1) {
            if (adjust == os.left)
                unitsperline = 32 / sizeof(T);
            else if (showpos)
                unitsperline = 64 / sizeof(T);
            else
                unitsperline = 16 / sizeof(T);
        }

        auto p = _first;

        //auto prevp = p;
        auto prevline = std::make_pair(p, p);

        os << std::right;
        os.width(0);
        while (p < _last) {
            auto pend = unitsperline ? std::min(_last, p+unitsperline) : _last;
            auto curline = std::make_pair(p, pend);
            if (summarize) {
                if (data_is_equal(prevline, curline)) {
                    int count = count_identical_lines(p, _last, unitsperline);
                    if (count > threshold) {
                        os << "* [ 0x" << std::hex << count << " lines ]\n";
                        pend = p + count * unitsperline;

                        goto next;
                    }
                }
                else {
                    prevline = curline;
                }
            }

            if (showoffset)
                os << std::setw(8) << std::setfill('0') << std::hex << ofs << ": ";
            if (!showpos) {
                output_hex(os, curline.first, curline.second, filler, numberbase, showbase, uppercasehex);
                if (unitsperline && pend-p != unitsperline)
                    output_padding(os, unitsperline-(pend-p), filler);
            }

            if (!showpos && adjust != os.left)
                os << "  ";   // separate left from right
            if (adjust != os.left)
            {
                output_asc(os, curline.first, curline.second);
                if (unitsperline && pend-p != unitsperline)
                    output_asc_padding(os, unitsperline-(pend-p));
            }

            if (unitsperline)
                os << "\n";

        next:
            if (step) {
                ofs += step;
                p += step;
            }
            else {
                ofs += sizeof(T) * (pend-p);
                p = pend;
            }
        }
        clearflags(os);
    }